

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::Attribute::get_value<bool>(Attribute *this,bool *v)

{
  value_type *pvVar1;
  undefined1 local_24 [2];
  optional<bool> local_22 [4];
  optional<bool> ret;
  bool *v_local;
  Attribute *this_local;
  
  if (v == (bool *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    unique0x100000f6 = v;
    primvar::PrimVar::get_value<bool>((PrimVar *)local_24);
    nonstd::optional_lite::optional<bool>::optional<bool,_0>
              ((optional<bool> *)(local_24 + 2),(optional<bool> *)local_24);
    nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)local_24);
    this_local._7_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(local_24 + 2));
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(local_24 + 2));
      *(byte *)stack0xffffffffffffffe0 = *pvVar1 & 1;
    }
    nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)(local_24 + 2));
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }